

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_do_handle_certificate(ptls_t *tls,uint8_t *src,uint8_t *end)

{
  int local_2c;
  int ret;
  int got_certs;
  uint8_t *end_local;
  uint8_t *src_local;
  ptls_t *tls_local;
  
  _ret = end;
  end_local = src;
  src_local = (uint8_t *)tls;
  tls_local._4_4_ = handle_certificate(tls,src,end,&local_2c);
  if (tls_local._4_4_ == 0) {
    if (local_2c == 0) {
      tls_local._4_4_ = 0x2f;
    }
    else {
      tls_local._4_4_ = 0;
    }
  }
  return tls_local._4_4_;
}

Assistant:

static int client_do_handle_certificate(ptls_t *tls, const uint8_t *src, const uint8_t *end)
{
    int got_certs, ret;

    if ((ret = handle_certificate(tls, src, end, &got_certs)) != 0)
        return ret;
    if (!got_certs)
        return PTLS_ALERT_ILLEGAL_PARAMETER;

    return 0;
}